

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitCall
          (Flow *__return_storage_ptr__,ConstantExpressionRunner<wasm::CExpressionRunner> *this,
          Call *curr)

{
  unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
  *__ht;
  __node_base_ptr *__return_storage_ptr___00;
  Module *this_00;
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Function *this_01;
  size_t sVar4;
  Expression **ppEVar5;
  SmallVector<wasm::Literal,_1UL> *this_02;
  Signature SVar6;
  undefined1 local_c8 [8];
  unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
  prevLocalValues;
  Flow retFlow;
  uint local_34;
  
  if ((((((this->super_ExpressionRunner<wasm::CExpressionRunner>).field_0x1c & 2) != 0) &&
       (this_00 = (this->super_ExpressionRunner<wasm::CExpressionRunner>).module,
       this_00 != (Module *)0x0)) &&
      (this_01 = Module::getFunction(this_00,(Name)(curr->target).super_IString.str),
      (this_01->super_Importable).module.super_IString.str._M_str == (char *)0x0)) &&
     (SVar6 = HeapType::getSignature(&this_01->type), 1 < SVar6.results.id.id)) {
    uVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    sVar4 = Function::getNumParams(this_01);
    if (uVar1 != sVar4) {
      __assert_fail("numOperands == func->getNumParams()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x85e,
                    "Flow wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitCall(Call *) [SubType = wasm::CExpressionRunner]"
                   );
    }
    __ht = &this->localValues;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)local_c8,&__ht->_M_h);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&__ht->_M_h);
    __return_storage_ptr___00 = &prevLocalValues._M_h._M_single_bucket;
    for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(curr->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)local_34);
      ExpressionRunner<wasm::CExpressionRunner>::visit
                ((Flow *)__return_storage_ptr___00,
                 &this->super_ExpressionRunner<wasm::CExpressionRunner>,*ppEVar5);
      if (retFlow.breakTo.super_IString.str._M_len == 0) {
        if ((long)&(prevLocalValues._M_h._M_single_bucket)->_M_nxt +
            (long)((long)retFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_start -
                  retFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) /
            0x18 == 0) {
          __assert_fail("argFlow.values.isConcrete()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                        ,0x864,
                        "Flow wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitCall(Call *) [SubType = wasm::CExpressionRunner]"
                       );
        }
        this_02 = &std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)__ht,&local_34)->super_SmallVector<wasm::Literal,_1UL>;
        SmallVector<wasm::Literal,_1UL>::operator=
                  (this_02,(SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr___00);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr___00);
    }
    ExpressionRunner<wasm::CExpressionRunner>::visit
              ((Flow *)&prevLocalValues._M_h._M_single_bucket,
               &this->super_ExpressionRunner<wasm::CExpressionRunner>,this_01->body);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::operator=(&__ht->_M_h,
                (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_c8);
    if (retFlow.breakTo.super_IString.str._M_len == RETURN_FLOW._8_8_) {
      Flow::Flow(__return_storage_ptr__,(Literals *)&prevLocalValues._M_h._M_single_bucket);
    }
    else {
      if (retFlow.breakTo.super_IString.str._M_len != 0) {
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&prevLocalValues._M_h._M_single_bucket);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_c8);
        goto LAB_007a0a55;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)&prevLocalValues._M_h._M_single_bucket);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&prevLocalValues._M_h._M_single_bucket);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Literals>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_c8);
    return __return_storage_ptr__;
  }
LAB_007a0a55:
  uVar3 = NONCONSTANT_FLOW._8_8_;
  uVar2 = NONCONSTANT_FLOW._0_8_;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar2;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar3;
  return __return_storage_ptr__;
}

Assistant:

Flow visitCall(Call* curr) {
    NOTE_ENTER("Call");
    NOTE_NAME(curr->target);
    // Traverse into functions using the same mode, which we can also do
    // when replacing as long as the function does not have any side effects.
    // Might yield something useful for simple functions like `clamp`, sometimes
    // even if arguments are only partially constant or not constant at all.
    if ((flags & FlagValues::TRAVERSE_CALLS) != 0 && this->module != nullptr) {
      auto* func = this->module->getFunction(curr->target);
      if (!func->imported()) {
        if (func->getResults().isConcrete()) {
          auto numOperands = curr->operands.size();
          assert(numOperands == func->getNumParams());
          auto prevLocalValues = localValues;
          localValues.clear();
          for (Index i = 0; i < numOperands; ++i) {
            auto argFlow = ExpressionRunner<SubType>::visit(curr->operands[i]);
            if (!argFlow.breaking()) {
              assert(argFlow.values.isConcrete());
              localValues[i] = argFlow.values;
            }
          }
          auto retFlow = ExpressionRunner<SubType>::visit(func->body);
          localValues = prevLocalValues;
          if (retFlow.breakTo == RETURN_FLOW) {
            return Flow(retFlow.values);
          } else if (!retFlow.breaking()) {
            return retFlow;
          }
        }
      }
    }
    return Flow(NONCONSTANT_FLOW);
  }